

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O2

void __thiscall glslang::TReflection::~TReflection(TReflection *this)

{
  this->_vptr_TReflection = (_func_int **)&PTR__TReflection_0089a778;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->atomicCounterUniformIndices).super__Vector_base<int,_std::allocator<int>_>);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToPipeOutput);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToPipeInput);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToBufferBlock);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToBufferVariable);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToUniformBlock);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToUniform);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->pipeOutNameToIndex)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->pipeInNameToIndex)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->nameToIndex)._M_t);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

virtual ~TReflection() {}